

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind)

{
  TokenKind in_DI;
  bool local_1;
  
  if (((((in_DI == OpenParenthesis) || (in_DI == Comma)) || ((ushort)(in_DI - InOutKeyword) < 2)) ||
      ((in_DI == LocalKeyword || (in_DI == OutputKeyword)))) ||
     ((in_DI == PropertyKeyword || ((in_DI == RefKeyword || (in_DI == SequenceKeyword)))))) {
    local_1 = true;
  }
  else {
    local_1 = isPossibleDataType(in_DI);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::LocalKeyword:
        case TokenKind::PropertyKeyword:
        case TokenKind::SequenceKeyword:
        case TokenKind::Comma:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}